

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

int uECC_valid_point(uECC_word_t *point,uECC_Curve curve)

{
  uECC_word_t *puVar1;
  byte num_words;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 auVar8 [16];
  uECC_word_t tmp1 [4];
  uECC_word_t tmp2 [4];
  uECC_word_t auStack_88 [4];
  uECC_word_t local_68 [9];
  
  num_words = curve->num_words;
  uVar5 = (uint)num_words;
  if ((char)(num_words * '\x02') < '\x01') {
    return 0;
  }
  uVar7 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  uVar4 = 0;
  do {
    puVar1 = point + uVar4;
    uVar7 = uVar7 | (uint)*puVar1;
    uVar9 = uVar9 | *(uint *)((long)puVar1 + 4);
    uVar10 = uVar10 | (uint)puVar1[1];
    uVar11 = uVar11 | *(uint *)((long)puVar1 + 0xc);
    uVar4 = uVar4 + 2;
  } while ((byte)(num_words * '\x02') != uVar4);
  auVar8._0_4_ = -(uint)(uVar7 == 0);
  auVar8._4_4_ = -(uint)(uVar9 == 0);
  auVar8._8_4_ = -(uint)(uVar10 == 0);
  auVar8._12_4_ = -(uint)(uVar11 == 0);
  iVar3 = movmskps((int)uVar4,auVar8);
  uVar7 = uVar5;
  if (iVar3 == 0xf) {
    return 0;
  }
  while( true ) {
    uVar7 = uVar7 - 1;
    if ((char)uVar7 < '\0') {
      return 0;
    }
    uVar2 = (ulong)((uVar7 & 0x7f) << 3);
    uVar4 = *(ulong *)((long)curve->p + uVar2);
    uVar2 = *(ulong *)((long)point + uVar2);
    if (uVar2 < uVar4) break;
    if (uVar4 < uVar2) {
      return 0;
    }
  }
  puVar1 = point + (char)num_words;
  while( true ) {
    uVar5 = uVar5 - 1;
    if ((char)uVar5 < '\0') {
      return 0;
    }
    uVar2 = (ulong)((uVar5 & 0x7f) << 3);
    uVar4 = *(ulong *)((long)curve->p + uVar2);
    uVar2 = *(ulong *)((long)puVar1 + uVar2);
    if (uVar2 < uVar4) break;
    if (uVar4 < uVar2) {
      return 0;
    }
  }
  uECC_vli_mult(local_68,puVar1,puVar1,num_words);
  (*curve->mmod_fast)(auStack_88,local_68);
  (*curve->x_side)(local_68,point,curve);
  if (-1 < (char)(num_words - 1)) {
    uVar4 = (ulong)(byte)(num_words - 1);
    uVar2 = 0;
    do {
      uVar2 = uVar2 | local_68[uVar4] ^ auStack_88[uVar4];
      bVar6 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar6);
    return (uint)(uVar2 == 0);
  }
  return 1;
}

Assistant:

int uECC_valid_point(const uECC_word_t *point, uECC_Curve curve) {
    uECC_word_t tmp1[uECC_MAX_WORDS];
    uECC_word_t tmp2[uECC_MAX_WORDS];
    wordcount_t num_words = curve->num_words;

    /* The point at infinity is invalid. */
    if (EccPoint_isZero(point, curve)) {
        return 0;
    }

    /* x and y must be smaller than p. */
    if (uECC_vli_cmp_unsafe(curve->p, point, num_words) != 1 ||
            uECC_vli_cmp_unsafe(curve->p, point + num_words, num_words) != 1) {
        return 0;
    }

    uECC_vli_modSquare_fast(tmp1, point + num_words, curve);
    curve->x_side(tmp2, point, curve); /* tmp2 = x^3 + ax + b */

    /* Make sure that y^2 == x^3 + ax + b */
    return (int)(uECC_vli_equal(tmp1, tmp2, num_words));
}